

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::Parser::ParseSingleValue(Parser *this,string *name,Value *e,bool check_now)

{
  size_type *psVar1;
  string *this_00;
  BaseType BVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined1 check;
  undefined7 in_register_00000009;
  Value *pVVar9;
  char *pcVar10;
  long *plVar11;
  ulong *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  byte in_R8B;
  BaseType req;
  bool bVar16;
  bool *destmatch;
  bool match;
  float val;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  Value *local_118;
  allocator<char> local_109;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  byte local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  ulong local_38;
  
  pVVar9 = (Value *)CONCAT71(in_register_00000009,check_now);
  iVar5 = *(int *)((long)&name->field_2 + 0xc);
  if ((iVar5 == 0x2d) || (iVar5 == 0x2b)) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
    if (*(int *)((long)&name->field_2 + 0xc) == 0x104) {
      std::__cxx11::string::insert((ulong)&name[1]._M_string_length,0,'\x01');
      goto LAB_0011dc43;
    }
    _val = (pointer)&local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,"constant name expected","");
    Error(this,name);
LAB_0011e620:
    local_60.field_2._M_allocated_capacity = local_128._M_allocated_capacity;
    _Var15._M_p = _val;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val == &local_128) goto LAB_0011eaf0;
  }
  else {
LAB_0011dc43:
    BVar2 = (pVVar9->type).base_type;
    uVar14 = (ulong)BVar2;
    iVar5 = *(int *)((long)&name->field_2 + 0xc);
    req = (BaseType)pVVar9;
    local_118 = e;
    local_64 = in_R8B;
    if (iVar5 != 0x104) {
      if (iVar5 == 0x101) goto LAB_0011dc97;
      if (iVar5 == 0x103 && BVar2 - BASE_TYPE_FLOAT < 2) {
        TryTypedValue(this,name,(int)e,true,(Value *)0x1,req,(bool *)0xb);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
      }
      bVar3 = false;
      if (*(int *)((long)&name->field_2 + 0xc) == 0x102) {
        bVar16 = BVar2 - BASE_TYPE_UTYPE < 0xc;
        iVar5 = (int)local_118;
        check = 2;
        destmatch = (bool *)0x7;
        goto LAB_0011defa;
      }
LAB_0011df10:
      if (((!bVar3) && (((pVVar9->type).base_type - BASE_TYPE_VECTOR & 0xfffffffb) == 0)) &&
         (*(int *)((long)&name->field_2 + 0xc) == 0x5b)) {
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
        if (*(int *)((long)&name->field_2 + 0xc) != 0x5d) {
          _val = (pointer)&local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&val,"Expected `]` in vector default","");
          Error(this,name);
          goto LAB_0011e620;
        }
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
        bVar3 = true;
        std::__cxx11::string::operator=((string *)&pVVar9->constant,"[]");
      }
      if (bVar3) {
        BVar2 = (pVVar9->type).base_type;
        if ((BVar2 - BASE_TYPE_UTYPE < 0xc & local_64) == 1) {
          this_00 = &pVVar9->constant;
          iVar5 = std::__cxx11::string::compare((char *)this_00);
          if (iVar5 != 0) {
            switch(BVar2) {
            case BASE_TYPE_NONE:
            case BASE_TYPE_UTYPE:
            case BASE_TYPE_BOOL:
            case BASE_TYPE_UCHAR:
              anon_unknown_0::atot<unsigned_char>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (uchar *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<unsigned_char>(pVVar9,val._0_1_);
              break;
            case BASE_TYPE_CHAR:
              anon_unknown_0::atot<signed_char>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (char *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<signed_char>(pVVar9,val._0_1_);
              break;
            case BASE_TYPE_SHORT:
              anon_unknown_0::atot<short>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (short *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<short>(pVVar9,val._0_2_);
              break;
            case BASE_TYPE_USHORT:
              anon_unknown_0::atot<unsigned_short>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (unsigned_short *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<unsigned_short>(pVVar9,val._0_2_);
              break;
            case BASE_TYPE_INT:
              anon_unknown_0::atot<int>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (int *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<int>(pVVar9,(int)val);
              break;
            case BASE_TYPE_UINT:
              anon_unknown_0::atot<unsigned_int>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (uint *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<unsigned_int>(pVVar9,(uint)val);
              break;
            case BASE_TYPE_LONG:
              anon_unknown_0::atot<long>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (long *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<long>(pVVar9,(long)_val);
              break;
            case BASE_TYPE_ULONG:
              anon_unknown_0::atot<unsigned_long>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (unsigned_long *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              anon_unknown_0::SingleValueRepack<unsigned_long>(pVVar9,(unsigned_long)_val);
              break;
            case BASE_TYPE_FLOAT:
              anon_unknown_0::atot<float>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              if (NAN(val)) {
LAB_0011e9be:
                std::__cxx11::string::operator=((string *)this_00,"nan");
              }
              break;
            case BASE_TYPE_DOUBLE:
              anon_unknown_0::atot<double>
                        ((anon_unknown_0 *)this,(this_00->_M_dataplus)._M_p,(Parser *)name,
                         (double *)&val);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
              if (NAN((double)_val)) goto LAB_0011e9be;
            }
          }
        }
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
        goto LAB_0011eaf0;
      }
      _val = (pointer)&local_128;
      local_130 = 0;
      local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
      TokenToStringId_abi_cxx11_(&local_60,(Parser *)name,*(int *)((long)&name->field_2 + 0xc));
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x361bba);
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        local_78 = *plVar11;
        lStack_70 = plVar6[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar11;
        local_88 = (long *)*plVar6;
      }
      local_80 = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
      puVar12 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar12) {
        local_f8 = *puVar12;
        lStack_f0 = plVar6[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *puVar12;
        local_108 = (ulong *)*plVar6;
      }
      local_100 = plVar6[1];
      *plVar6 = (long)puVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (0x12 < (uint)uVar14) {
LAB_0011eb07:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                      ,0xaa,"const char *flatbuffers::TypeName(const BaseType)");
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,*(char **)(&DAT_003f1fa0 + uVar14 * 8),&local_109);
      uVar14 = 0xf;
      if (local_108 != &local_f8) {
        uVar14 = local_f8;
      }
      if (uVar14 < (ulong)(local_c0 + local_100)) {
        uVar14 = 0xf;
        if (local_c8 != local_b8) {
          uVar14 = local_b8[0];
        }
        if (uVar14 < (ulong)(local_c0 + local_100)) goto LAB_0011e183;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_108);
      }
      else {
LAB_0011e183:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c8);
      }
      local_e8 = &local_d8;
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_d8 = *plVar6;
        uStack_d0 = puVar7[3];
      }
      else {
        local_d8 = *plVar6;
        local_e8 = (long *)*puVar7;
      }
      local_e0 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)plVar6 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        local_98 = *plVar11;
        lStack_90 = plVar6[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar11;
        local_a8 = (long *)*plVar6;
      }
      local_a0 = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&val,(ulong)local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      Error(this,name);
      goto LAB_0011e620;
    }
    if (*(char *)name->_M_string_length == '(') {
      ParseFunction(this,name,e);
      goto LAB_0011eaf0;
    }
LAB_0011dc97:
    bVar3 = false;
    if (iVar5 == 0x101 && BVar2 == BASE_TYPE_STRING) {
      TryTypedValue(this,name,(int)e,true,(Value *)0x1,req,(bool *)0xd);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
    }
    if ((0xb < BVar2 - BASE_TYPE_UTYPE || iVar5 != 0x101) ||
       (*(char *)&name[1]._M_dataplus._M_p != '\0')) {
      bVar16 = SUB41(iVar5,0);
      if (BVar2 == BASE_TYPE_BOOL) {
        psVar1 = &name[1]._M_string_length;
        iVar4 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar4 == 0) {
          pcVar10 = "1";
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar4 != 0) goto LAB_0011e1f0;
          pcVar10 = "0";
        }
        std::__cxx11::string::_M_replace
                  ((ulong)psVar1,0,(char *)name[1].field_2._M_allocated_capacity,(ulong)pcVar10);
        if (iVar5 == *(int *)((long)&name->field_2 + 0xc)) {
          TryTypedValue(this,name,(int)local_118,bVar16,(Value *)0x1,req,(bool *)0x2);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
        }
      }
LAB_0011e1f0:
      if ((0xfffffff3 < BVar2 - BASE_TYPE_STRING) &&
         (iVar4 = std::__cxx11::string::compare((char *)&name[1]._M_string_length), iVar4 == 0)) {
        std::__cxx11::string::_M_replace
                  ((ulong)&pVVar9->constant,0,(char *)(pVVar9->constant)._M_string_length,0x36e41e);
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
        bVar3 = true;
      }
      if ((((!bVar3) && (BVar2 != BASE_TYPE_BOOL)) && (0xfffffff5 < BVar2 - BASE_TYPE_FLOAT)) &&
         (((int)*(char *)name[1]._M_string_length == 0x5f ||
          (((int)*(char *)name[1]._M_string_length & 0xffffffdfU) - 0x41 < 0x1a)))) {
        ParseEnumFromString(this,(Type *)name,(string *)pVVar9);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
        bVar3 = true;
      }
      if ((bool)(BVar2 - BASE_TYPE_UTYPE < 0xc & iVar5 == 0x101 & ~bVar3)) {
        psVar1 = &name[1]._M_string_length;
        local_38 = uVar14;
        lVar8 = std::__cxx11::string::find_last_not_of((char)psVar1,0x20);
        if (lVar8 != -1) {
          std::__cxx11::string::resize((ulong)psVar1,(char)lVar8 + '\x01');
        }
        uVar14 = local_38;
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1;
        if (((pVVar9->type).base_type - BASE_TYPE_FLOAT < 2) &&
           (lVar8 = std::__cxx11::string::rfind((char)psVar1,0x29), lVar8 != -1)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                         "invalid number: ",local_40);
          Error(this,name);
          local_60.field_2._M_allocated_capacity = local_128._M_allocated_capacity;
          _Var15._M_p = _val;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val == &local_128) goto LAB_0011eaf0;
          goto LAB_0011e633;
        }
      }
      iVar4 = (int)uVar14;
      if ((bool)(iVar4 - 0xbU < 2 & ~bVar3 & iVar5 == *(int *)((long)&name->field_2 + 0xc))) {
        TryTypedValue(this,name,(int)local_118,bVar16,(Value *)0x1,req,(bool *)0xb);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
      }
      if ((bool)(iVar4 - 1U < 10 & iVar5 == *(int *)((long)&name->field_2 + 0xc) & ~bVar3)) {
        TryTypedValue(this,name,(int)local_118,bVar16,(Value *)0x1,req,(bool *)0x7);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
      }
      if ((!bVar3) && (*(int *)((long)&name->field_2 + 0xc) == 0x101)) {
        bVar16 = iVar4 == 0xd;
        iVar5 = (int)local_118;
        check = true;
        destmatch = (bool *)0xd;
LAB_0011defa:
        TryTypedValue(this,name,iVar5,(bool)check,(Value *)(ulong)bVar16,req,destmatch);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0011eaf0;
      }
      goto LAB_0011df10;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "type mismatch or invalid value, an initializer of non-string field must be trivial ASCII string: type: "
               ,"");
    if (BASE_TYPE_VECTOR64 < BVar2) goto LAB_0011eb07;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_60);
    pVVar9 = local_118;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_78 = *plVar11;
      lStack_70 = plVar6[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar11;
      local_88 = (long *)*plVar6;
    }
    local_80 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_108 = &local_f8;
    puVar12 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar12) {
      local_f8 = *puVar12;
      lStack_f0 = plVar6[3];
    }
    else {
      local_f8 = *puVar12;
      local_108 = (ulong *)*plVar6;
    }
    local_100 = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_c8 = local_b8;
    if (pVVar9 == (Value *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,*(long *)&pVVar9->type,
                 (long)&(((pVVar9->type).struct_def)->super_Definition).name._M_dataplus._M_p +
                 *(long *)&pVVar9->type);
    }
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c8);
    local_e8 = &local_d8;
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_d8 = *plVar6;
      uStack_d0 = puVar7[3];
    }
    else {
      local_d8 = *plVar6;
      local_e8 = (long *)*puVar7;
    }
    local_e0 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_98 = *plVar11;
      lStack_90 = plVar6[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar11;
      local_a8 = (long *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,name[1]._M_string_length);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar13) {
      local_128._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_128._8_8_ = plVar6[3];
      _val = (pointer)&local_128;
    }
    else {
      local_128._M_allocated_capacity = paVar13->_M_allocated_capacity;
      _val = (pointer)*plVar6;
    }
    local_130 = plVar6[1];
    *plVar6 = (long)paVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    Error(this,name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_128) {
      operator_delete(_val,local_128._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    _Var15._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_0011eaf0;
  }
LAB_0011e633:
  operator_delete(_Var15._M_p,local_60.field_2._M_allocated_capacity + 1);
LAB_0011eaf0:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseSingleValue(const std::string *name, Value &e,
                                      bool check_now) {
  if (token_ == '+' || token_ == '-') {
    const char sign = static_cast<char>(token_);
    // Get an indentifier: NAN, INF, or function name like cos/sin/deg.
    NEXT();
    if (token_ != kTokenIdentifier) return Error("constant name expected");
    attribute_.insert(size_t(0), size_t(1), sign);
  }

  const auto in_type = e.type.base_type;
  const auto is_tok_ident = (token_ == kTokenIdentifier);
  const auto is_tok_string = (token_ == kTokenStringConstant);

  // First see if this could be a conversion function.
  if (is_tok_ident && *cursor_ == '(') { return ParseFunction(name, e); }

  // clang-format off
  auto match = false;

  #define IF_ECHECK_(force, dtoken, check, req)    \
    if (!match && ((dtoken) == token_) && ((check) || flatbuffers::IsConstTrue(force))) \
      ECHECK(TryTypedValue(name, dtoken, check, e, req, &match))
  #define TRY_ECHECK(dtoken, check, req) IF_ECHECK_(false, dtoken, check, req)
  #define FORCE_ECHECK(dtoken, check, req) IF_ECHECK_(true, dtoken, check, req)
  // clang-format on

  if (is_tok_ident || is_tok_string) {
    const auto kTokenStringOrIdent = token_;
    // The string type is a most probable type, check it first.
    TRY_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
               BASE_TYPE_STRING);

    // avoid escaped and non-ascii in the string
    if (!match && is_tok_string && IsScalar(in_type) &&
        !attr_is_trivial_ascii_string_) {
      return Error(
          std::string("type mismatch or invalid value, an initializer of "
                      "non-string field must be trivial ASCII string: type: ") +
          TypeName(in_type) + ", name: " + (name ? *name : "") +
          ", value: " + attribute_);
    }

    // A boolean as true/false. Boolean as Integer check below.
    if (!match && IsBool(in_type)) {
      auto is_true = attribute_ == "true";
      if (is_true || attribute_ == "false") {
        attribute_ = is_true ? "1" : "0";
        // accepts both kTokenStringConstant and kTokenIdentifier
        TRY_ECHECK(kTokenStringOrIdent, IsBool(in_type), BASE_TYPE_BOOL);
      }
    }
    // Check for optional scalars.
    if (!match && IsScalar(in_type) && attribute_ == "null") {
      e.constant = "null";
      NEXT();
      match = true;
    }
    // Check if this could be a string/identifier enum value.
    // Enum can have only true integer base type.
    if (!match && IsInteger(in_type) && !IsBool(in_type) &&
        IsIdentifierStart(*attribute_.c_str())) {
      ECHECK(ParseEnumFromString(e.type, &e.constant));
      NEXT();
      match = true;
    }
    // Parse a float/integer number from the string.
    // A "scalar-in-string" value needs extra checks.
    if (!match && is_tok_string && IsScalar(in_type)) {
      // Strip trailing whitespaces from attribute_.
      auto last_non_ws = attribute_.find_last_not_of(' ');
      if (std::string::npos != last_non_ws) attribute_.resize(last_non_ws + 1);
      if (IsFloat(e.type.base_type)) {
        // The functions strtod() and strtof() accept both 'nan' and
        // 'nan(number)' literals. While 'nan(number)' is rejected by the parser
        // as an unsupported function if is_tok_ident is true.
        if (attribute_.find_last_of(')') != std::string::npos) {
          return Error("invalid number: " + attribute_);
        }
      }
    }
    // Float numbers or nan, inf, pi, etc.
    TRY_ECHECK(kTokenStringOrIdent, IsFloat(in_type), BASE_TYPE_FLOAT);
    // An integer constant in string.
    TRY_ECHECK(kTokenStringOrIdent, IsInteger(in_type), BASE_TYPE_INT);
    // Unknown tokens will be interpreted as string type.
    // An attribute value may be a scalar or string constant.
    FORCE_ECHECK(kTokenStringConstant, in_type == BASE_TYPE_STRING,
                 BASE_TYPE_STRING);
  } else {
    // Try a float number.
    TRY_ECHECK(kTokenFloatConstant, IsFloat(in_type), BASE_TYPE_FLOAT);
    // Integer token can init any scalar (integer of float).
    FORCE_ECHECK(kTokenIntegerConstant, IsScalar(in_type), BASE_TYPE_INT);
  }
  // Match empty vectors for default-empty-vectors.
  if (!match && IsVector(e.type) && token_ == '[') {
    NEXT();
    if (token_ != ']') { return Error("Expected `]` in vector default"); }
    NEXT();
    match = true;
    e.constant = "[]";
  }

#undef FORCE_ECHECK
#undef TRY_ECHECK
#undef IF_ECHECK_

  if (!match) {
    std::string msg;
    msg += "Cannot assign token starting with '" + TokenToStringId(token_) +
           "' to value of <" + std::string(TypeName(in_type)) + "> type.";
    return Error(msg);
  }
  const auto match_type = e.type.base_type;  // may differ from in_type
  // The check_now flag must be true when parse a fbs-schema.
  // This flag forces to check default scalar values or metadata of field.
  // For JSON parser the flag should be false.
  // If it is set for JSON each value will be checked twice (see ParseTable).
  // Special case 'null' since atot can't handle that.
  if (check_now && IsScalar(match_type) && e.constant != "null") {
    // clang-format off
    switch (match_type) {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
      case BASE_TYPE_ ## ENUM: {\
          CTYPE val; \
          ECHECK(atot(e.constant.c_str(), *this, &val)); \
          SingleValueRepack(e, val); \
        break; }
    FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    default: break;
    }
    // clang-format on
  }
  return NoError();
}